

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppLayout.cpp
# Opt level: O1

IWindowPtr __thiscall cursespp::AppLayout::GetFocus(AppLayout *this)

{
  _func_int **pp_Var1;
  char cVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  long in_RSI;
  IWindowPtr IVar4;
  
  cVar2 = (**(code **)(**(long **)(in_RSI + 0x260) + 0x120))();
  _Var3._M_pi = extraout_RDX;
  if (cVar2 == '\0') {
    if (*(long **)(in_RSI + 0x270) == (long *)0x0) {
      (this->super_LayoutBase).super_Window.super_IWindow.super_IOrderable._vptr_IOrderable =
           (_func_int **)0x0;
      (this->super_LayoutBase).super_Window.super_IWindow.super_IDisplayable._vptr_IDisplayable =
           (_func_int **)0x0;
    }
    else {
      (**(code **)(**(long **)(in_RSI + 0x270) + 0x1d0))(this);
      _Var3._M_pi = extraout_RDX_00;
    }
  }
  else {
    (this->super_LayoutBase).super_Window.super_IWindow.super_IOrderable._vptr_IOrderable =
         *(_func_int ***)(in_RSI + 0x260);
    pp_Var1 = *(_func_int ***)(in_RSI + 0x268);
    (this->super_LayoutBase).super_Window.super_IWindow.super_IDisplayable._vptr_IDisplayable =
         pp_Var1;
    if (pp_Var1 != (_func_int **)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(pp_Var1 + 1) = *(int *)(pp_Var1 + 1) + 1;
        UNLOCK();
      }
      else {
        *(int *)(pp_Var1 + 1) = *(int *)(pp_Var1 + 1) + 1;
      }
    }
  }
  IVar4.super___shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  IVar4.super___shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (IWindowPtr)IVar4.super___shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

cursespp::IWindowPtr AppLayout::GetFocus() {
    if (this->shortcuts->IsFocused()) {
        return this->shortcuts;
    }
    if (this->layout) {
        return this->layout->GetFocus();
    }
    return cursespp::IWindowPtr();
}